

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::FixF0Contour
               (double frame_period,int number_of_candidates,int fs,double **f0_candidates,
               double *best_f0_contour,int f0_length,double f0_floor,double allowed_range,
               double *fixed_f0_contour)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  double *best_f0_contour_00;
  double *f0_step2;
  int *positive_index_00;
  double **f0_candidates_00;
  int in_R8D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int *negative_index;
  int *positive_index;
  int negative_count;
  int positive_count;
  double *f0_tmp2;
  double *f0_tmp1;
  int voice_range_minimum;
  undefined8 in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  int number_of_candidates_00;
  double *in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  
  number_of_candidates_00 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  iVar5 = (int)((1000.0 / in_XMM0_Qa) / in_XMM1_Qa + 0.5) * 2 + 1;
  if (iVar5 < in_R8D) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)in_R8D;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    best_f0_contour_00 = (double *)operator_new__(uVar6);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)in_R8D;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    f0_step2 = (double *)operator_new__(uVar6);
    FixStep1(best_f0_contour_00,(int)((ulong)f0_step2 >> 0x20),(int)f0_step2,
             (double)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    FixStep2(best_f0_contour_00,in_R8D,iVar5,f0_step2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)in_R8D;
    uVar6 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    positive_index_00 = (int *)operator_new__(uVar6);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)in_R8D;
    uVar6 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    f0_candidates_00 = (double **)operator_new__(uVar6);
    memset(positive_index_00,0,(long)in_R8D << 2);
    memset(f0_candidates_00,0,(long)in_R8D << 2);
    GetNumberOfVoicedSections
              (f0_step2,in_R8D,positive_index_00,(int *)f0_candidates_00,
               (int *)&stack0xffffffffffffffa4,(int *)&stack0xffffffffffffffa0);
    iVar5 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    FixStep3(in_stack_ffffffffffffffa0,(int)((ulong)positive_index_00 >> 0x20),f0_candidates_00,
             number_of_candidates_00,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,iVar5,
             best_f0_contour_00);
    FixStep4(in_stack_ffffffffffffffa0,(int)((ulong)positive_index_00 >> 0x20),f0_candidates_00,
             number_of_candidates_00,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,iVar5,
             best_f0_contour_00);
    if (best_f0_contour_00 != (double *)0x0) {
      operator_delete__(best_f0_contour_00);
    }
    if (f0_step2 != (double *)0x0) {
      operator_delete__(f0_step2);
    }
    if (positive_index_00 != (int *)0x0) {
      operator_delete__(positive_index_00);
    }
    if (f0_candidates_00 != (double **)0x0) {
      operator_delete__(f0_candidates_00);
    }
  }
  return;
}

Assistant:

static void FixF0Contour(double frame_period, int number_of_candidates,
    int fs, const double * const * f0_candidates,
    const double *best_f0_contour, int f0_length, double f0_floor,
    double allowed_range, double *fixed_f0_contour) {
  int voice_range_minimum =
    static_cast<int>(0.5 + 1000.0 / frame_period / f0_floor) * 2 + 1;

  if (f0_length <= voice_range_minimum) return;

  double *f0_tmp1 = new double[f0_length];
  double *f0_tmp2 = new double[f0_length];

  FixStep1(best_f0_contour, f0_length, voice_range_minimum,
      allowed_range, f0_tmp1);
  FixStep2(f0_tmp1, f0_length, voice_range_minimum, f0_tmp2);

  int positive_count, negative_count;
  int *positive_index = new int[f0_length];
  int *negative_index = new int[f0_length];
#if 1
  memset(positive_index, 0, sizeof(int) * f0_length);
  memset(negative_index, 0, sizeof(int) * f0_length);
#endif
  GetNumberOfVoicedSections(f0_tmp2, f0_length, positive_index,
      negative_index, &positive_count, &negative_count);
  FixStep3(f0_tmp2, f0_length, f0_candidates, number_of_candidates,
      allowed_range, negative_index, negative_count, f0_tmp1);
  FixStep4(f0_tmp1, f0_length, f0_candidates, number_of_candidates,
      allowed_range, positive_index, positive_count, fixed_f0_contour);

  delete[] f0_tmp1;
  delete[] f0_tmp2;
  delete[] positive_index;
  delete[] negative_index;
}